

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegls.cpp
# Opt level: O0

vector<signed_char,_std::allocator<signed_char>_> *
charls::anon_unknown_79::create_quantize_lut_lossless
          (vector<signed_char,_std::allocator<signed_char>_> *__return_storage_ptr__,
          int32_t bit_count)

{
  int8_t iVar1;
  int32_t maximum_sample_value;
  long lVar2;
  size_type sVar3;
  reference pvVar4;
  size_type local_48;
  size_t i;
  allocator<signed_char> local_2e;
  undefined1 local_2d;
  int local_2c;
  undefined1 local_28 [4];
  int32_t range;
  jpegls_pc_parameters preset;
  int32_t bit_count_local;
  vector<signed_char,_std::allocator<signed_char>_> *lut;
  
  preset.threshold3 = bit_count;
  unique0x100000eb = __return_storage_ptr__;
  maximum_sample_value = calculate_maximum_sample_value(bit_count);
  compute_default((jpegls_pc_parameters *)local_28,maximum_sample_value,0);
  local_2c = (int)local_28 + 1;
  local_2d = 0;
  lVar2 = (long)local_2c;
  std::allocator<signed_char>::allocator(&local_2e);
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            (__return_storage_ptr__,lVar2 * 2,&local_2e);
  std::allocator<signed_char>::~allocator(&local_2e);
  for (local_48 = 0;
      sVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::size(__return_storage_ptr__),
      local_48 != sVar3; local_48 = local_48 + 1) {
    iVar1 = quantize_gradient_org((jpegls_pc_parameters *)local_28,(int)local_48 - local_2c);
    pvVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       (__return_storage_ptr__,local_48);
    *pvVar4 = iVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int8_t> create_quantize_lut_lossless(const int32_t bit_count)
{
    const jpegls_pc_parameters preset{compute_default(calculate_maximum_sample_value(bit_count), 0)};
    const int32_t range{preset.maximum_sample_value + 1};

    vector<int8_t> lut(static_cast<size_t>(range) * 2);
    for (size_t i{}; i != lut.size(); ++i)
    {
        lut[i] = quantize_gradient_org(preset, static_cast<int32_t>(i) - range);
    }

    return lut;
}